

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O3

void ftest_insert(planck_unit_test_t *tc,ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  FILE *pFVar1;
  planck_unit_result_t pVar2;
  char cVar3;
  ion_err_t iVar4;
  int iVar5;
  ion_status_t iVar6;
  ulong uVar7;
  size_t sVar8;
  undefined7 in_register_00000081;
  long lVar9;
  undefined1 *__s2;
  undefined1 *__ptr;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  ion_flat_file_row_t test_row;
  
  uStack_70 = 0x101466;
  iVar6 = flat_file_insert(flat_file,key,value);
  uStack_70 = 0x101483;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000081,expected_status),(int)iVar6.error,
                     0x83,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                    );
  __ptr = local_68;
  if (pVar2 != '\0') {
    uStack_70 = 0x1014a9;
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar6.count,0x84,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                      );
    __ptr = local_68;
    if (pVar2 != '\0') {
      if (check_result != '\0') {
        uVar7 = flat_file->row_size + 0xf & 0xfffffffffffffff0;
        lVar9 = -uVar7;
        __s2 = local_68 + lVar9;
        test_row.value = local_68;
        local_68[-uVar7] = 1;
        sVar8 = (size_t)(flat_file->super).record.key_size;
        *(undefined8 *)(local_68 + lVar9 + -8) = 0x1014f6;
        memcpy(local_68 + lVar9 + 1,key,sVar8);
        iVar5 = (flat_file->super).record.value_size;
        *(undefined8 *)(local_68 + lVar9 + -8) = 0x10150a;
        memcpy(__s2 + sVar8 + 1,value,(long)iVar5);
        __ptr = __s2 + -(flat_file->row_size + 0xf & 0xfffffffffffffff0);
        lVar9 = flat_file->start_of_data;
        pFVar1 = (FILE *)flat_file->data_file;
        *(undefined8 *)(__ptr + -8) = 0x10152e;
        fseek(pFVar1,lVar9,0);
        pFVar1 = (FILE *)flat_file->data_file;
        sVar8 = flat_file->row_size;
        *(undefined8 *)(__ptr + -8) = 0x101543;
        sVar8 = fread(__ptr,sVar8,1,pFVar1);
        if (sVar8 == 1) {
          lVar9 = 0;
          do {
            sVar8 = flat_file->row_size;
            *(undefined8 *)(__ptr + -8) = 0x10155e;
            iVar5 = bcmp(__ptr,__s2,sVar8);
            if (iVar5 == 0) {
              *(undefined8 *)(__ptr + -8) = 0x1015b1;
              iVar4 = flat_file_read_row(flat_file,lVar9,(ion_flat_file_row_t *)local_68);
              *(undefined8 *)(__ptr + -8) = 0x1015ce;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,0,(int)iVar4,0x9c,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_00101664;
              *(undefined8 *)(__ptr + -8) = 0x1015f3;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,1,(uint)local_68[0],0x9d,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_00101664;
              iVar5 = (flat_file->super).record.key_size;
              *(undefined8 *)(__ptr + -8) = 0x101608;
              iVar5 = memcmp((void *)test_row._0_8_,key,(long)iVar5);
              *(undefined8 *)(__ptr + -8) = 0x101620;
              pVar2 = planck_unit_assert_int_are_equal
                                (tc,0,iVar5,0x9e,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              if (pVar2 == '\0') goto LAB_00101664;
              iVar5 = (flat_file->super).record.value_size;
              *(undefined8 *)(__ptr + -8) = 0x101635;
              iVar5 = memcmp(test_row.key,value,(long)iVar5);
              *(undefined8 *)(__ptr + -8) = 0x10164d;
              cVar3 = planck_unit_assert_int_are_equal
                                (tc,0,iVar5,0x9f,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                                );
              goto LAB_0010164d;
            }
            lVar9 = lVar9 + 1;
            pFVar1 = (FILE *)flat_file->data_file;
            *(undefined8 *)(__ptr + -8) = 0x101579;
            sVar8 = fread(__ptr,sVar8,1,pFVar1);
          } while (sVar8 == 1);
        }
        *(undefined8 *)(__ptr + -8) = 0x10159d;
        cVar3 = planck_unit_assert_true
                          (tc,0,0xa7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                           ,"asserted to fail");
LAB_0010164d:
        if (cVar3 == '\0') goto LAB_00101664;
      }
      return;
    }
  }
LAB_00101664:
  *(code **)(__ptr + -8) = ftest_delete;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
ftest_insert(
	planck_unit_test_t	*tc,
	ion_flat_file_t		*flat_file,
	ion_key_t			key,
	ion_value_t			value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = flat_file_insert(flat_file, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		ion_byte_t expected_result[flat_file->row_size];

		memset(expected_result, ION_FLAT_FILE_STATUS_OCCUPIED, sizeof(ion_flat_file_row_status_t));
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t), key, flat_file->super.record.key_size);
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size, value, flat_file->super.record.value_size);

		ion_byte_t read_buffer[flat_file->row_size];

		fseek(flat_file->data_file, flat_file->start_of_data, SEEK_SET);

		ion_fpos_t cur_index = 0;

		while (boolean_true) {
			if (1 != fread(read_buffer, flat_file->row_size, 1, flat_file->data_file)) {
				break;
			}

			if (0 == memcmp(read_buffer, expected_result, flat_file->row_size)) {
				ion_flat_file_row_t test_row;
				ion_err_t			err = flat_file_read_row(flat_file, cur_index, &test_row);

				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ION_FLAT_FILE_STATUS_OCCUPIED, test_row.row_status);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.key, key, flat_file->super.record.key_size));
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.value, value, flat_file->super.record.value_size));
				return;
			}

			cur_index++;
		}

		/* If we reach here that means that the record we were looking for wasn't found :( */
		PLANCK_UNIT_SET_FAIL(tc);
	}
}